

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_connect(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  _Bool _Var2;
  CURLcode result;
  ssl_connect_data *connssl;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  _Var2 = ssl_prefs_check(data);
  if (_Var2) {
    *(undefined4 *)((long)pvVar1 + 0xa8) = 2;
    cf_local._4_4_ = (*Curl_ssl->connect_blocking)(cf,data);
  }
  else {
    cf_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode ssl_connect(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  CURLcode result;

  if(!ssl_prefs_check(data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl-enabled from here on. */
  connssl->state = ssl_connection_negotiating;

  result = Curl_ssl->connect_blocking(cf, data);

  if(!result) {
    DEBUGASSERT(connssl->state == ssl_connection_complete);
  }

  return result;
}